

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O3

bool __thiscall
moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::ExplicitProducer::
enqueue<(moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::AllocationMode)0,_zframe_t*const&>
          (ExplicitProducer *this,_zframe_t **element)

{
  ulong uVar1;
  long lVar2;
  Block *pBVar3;
  long lVar4;
  Block *pBVar5;
  bool bVar6;
  Block *pBVar7;
  long lVar8;
  
  uVar1 = *(ulong *)(this + 0x20);
  if ((uVar1 & 0xff) == 0) {
    if ((*(long *)(this + 0x40) == 0) ||
       (*(long *)(*(long *)(*(long *)(this + 0x40) + 0x800) + 0x808) != 0x100)) {
      if (((0x7ffffffffffffffe < (*(long *)(this + 0x28) - uVar1) + 0x7ffffffffffffeff) ||
          (((*(long *)(this + 0x80) == 0 || (*(size_t *)(this + 0x60) == *(size_t *)(this + 0x68)))
           && (bVar6 = ConcurrentQueue<_zframe_t_*,_MyTraits>::ExplicitProducer::new_block_index
                                 ((ExplicitProducer *)this,*(size_t *)(this + 0x60)), !bVar6)))) ||
         (pBVar7 = requisition_block<(moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::AllocationMode)0>
                             (*(ConcurrentQueue<_zframe_t*,MyTraits> **)(this + 0x50)),
         pBVar7 == (Block *)0x0)) {
        return false;
      }
      (pBVar7->elementsCompletelyDequeued).super___atomic_base<unsigned_long>._M_i = 0;
      pBVar3 = *(Block **)(this + 0x40);
      pBVar5 = pBVar7;
      if (pBVar3 != (Block *)0x0) {
        pBVar7->next = pBVar3->next;
        pBVar5 = pBVar3;
      }
      pBVar5->next = pBVar7;
      *(Block **)(this + 0x40) = pBVar7;
      *(long *)(this + 0x60) = *(long *)(this + 0x60) + 1;
    }
    else {
      lVar2 = *(long *)(*(long *)(this + 0x40) + 0x800);
      *(long *)(this + 0x40) = lVar2;
      *(undefined8 *)(lVar2 + 0x808) = 0;
      pBVar7 = *(Block **)(this + 0x40);
    }
    lVar2 = *(long *)(*(long *)(this + 0x58) + 0x10);
    lVar4 = *(long *)(this + 0x70);
    lVar8 = lVar4 * 0x10;
    *(ulong *)(lVar2 + lVar8) = uVar1;
    *(Block **)(lVar2 + 8 + lVar8) = pBVar7;
    *(long *)(*(long *)(this + 0x58) + 8) = lVar4;
    *(ulong *)(this + 0x70) = *(long *)(this + 0x68) - 1U & *(long *)(this + 0x70) + 1U;
  }
  *(_zframe_t **)(*(long *)(this + 0x40) + (uVar1 & 0xff) * 8) = *element;
  *(ulong *)(this + 0x20) = uVar1 + 1;
  return true;
}

Assistant:

inline bool enqueue(U&& element)
		{
			index_t currentTailIndex = this->tailIndex.load(std::memory_order_relaxed);
			index_t newTailIndex = 1 + currentTailIndex;
			if ((currentTailIndex & static_cast<index_t>(BLOCK_SIZE - 1)) == 0) {
				// We reached the end of a block, start a new one
				auto startBlock = this->tailBlock;
				auto originalBlockIndexSlotsUsed = pr_blockIndexSlotsUsed;
				if (this->tailBlock != nullptr && this->tailBlock->next->ConcurrentQueue::Block::template is_empty<explicit_context>()) {
					// We can re-use the block ahead of us, it's empty!					
					this->tailBlock = this->tailBlock->next;
					this->tailBlock->ConcurrentQueue::Block::template reset_empty<explicit_context>();
					
					// We'll put the block on the block index (guaranteed to be room since we're conceptually removing the
					// last block from it first -- except instead of removing then adding, we can just overwrite).
					// Note that there must be a valid block index here, since even if allocation failed in the ctor,
					// it would have been re-attempted when adding the first block to the queue; since there is such
					// a block, a block index must have been successfully allocated.
				}
				else {
					// Whatever head value we see here is >= the last value we saw here (relatively),
					// and <= its current value. Since we have the most recent tail, the head must be
					// <= to it.
					auto head = this->headIndex.load(std::memory_order_relaxed);
					assert(!details::circular_less_than<index_t>(currentTailIndex, head));
					if (!details::circular_less_than<index_t>(head, currentTailIndex + BLOCK_SIZE)
						|| (MAX_SUBQUEUE_SIZE != details::const_numeric_max<size_t>::value && (MAX_SUBQUEUE_SIZE == 0 || MAX_SUBQUEUE_SIZE - BLOCK_SIZE < currentTailIndex - head))) {
						// We can't enqueue in another block because there's not enough leeway -- the
						// tail could surpass the head by the time the block fills up! (Or we'll exceed
						// the size limit, if the second part of the condition was true.)
						return false;
					}
					// We're going to need a new block; check that the block index has room
					if (pr_blockIndexRaw == nullptr || pr_blockIndexSlotsUsed == pr_blockIndexSize) {
						// Hmm, the circular block index is already full -- we'll need
						// to allocate a new index. Note pr_blockIndexRaw can only be nullptr if
						// the initial allocation failed in the constructor.
						
						if (allocMode == CannotAlloc || !new_block_index(pr_blockIndexSlotsUsed)) {
							return false;
						}
					}
					
					// Insert a new block in the circular linked list
					auto newBlock = this->parent->ConcurrentQueue::template requisition_block<allocMode>();
					if (newBlock == nullptr) {
						return false;
					}
#if MCDBGQ_TRACKMEM
					newBlock->owner = this;
#endif
					newBlock->ConcurrentQueue::Block::template reset_empty<explicit_context>();
					if (this->tailBlock == nullptr) {
						newBlock->next = newBlock;
					}
					else {
						newBlock->next = this->tailBlock->next;
						this->tailBlock->next = newBlock;
					}
					this->tailBlock = newBlock;
					++pr_blockIndexSlotsUsed;
				}
				
				if (!MOODYCAMEL_NOEXCEPT_CTOR(T, U, new (nullptr) T(std::forward<U>(element)))) {
					// The constructor may throw. We want the element not to appear in the queue in
					// that case (without corrupting the queue):
					MOODYCAMEL_TRY {
						new ((*this->tailBlock)[currentTailIndex]) T(std::forward<U>(element));
					}
					MOODYCAMEL_CATCH (...) {
						// Revert change to the current block, but leave the new block available
						// for next time
						pr_blockIndexSlotsUsed = originalBlockIndexSlotsUsed;
						this->tailBlock = startBlock == nullptr ? this->tailBlock : startBlock;
						MOODYCAMEL_RETHROW;
					}
				}
				else {
					(void)startBlock;
					(void)originalBlockIndexSlotsUsed;
				}
				
				// Add block to block index
				auto& entry = blockIndex.load(std::memory_order_relaxed)->entries[pr_blockIndexFront];
				entry.base = currentTailIndex;
				entry.block = this->tailBlock;
				blockIndex.load(std::memory_order_relaxed)->front.store(pr_blockIndexFront, std::memory_order_release);
				pr_blockIndexFront = (pr_blockIndexFront + 1) & (pr_blockIndexSize - 1);
				
				if (!MOODYCAMEL_NOEXCEPT_CTOR(T, U, new (nullptr) T(std::forward<U>(element)))) {
					this->tailIndex.store(newTailIndex, std::memory_order_release);
					return true;
				}
			}